

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp4.c
# Opt level: O3

void G4_Eb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UIntPtr UVar3;
  ulong uVar4;
  byte bVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  uint uVar13;
  undefined4 uVar14;
  
  UVar3 = (pMyDisasm->Reserved_).EIP_;
  uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
  if (uVar4 < UVar3 + 2 && uVar4 != 0) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  else {
    bVar5 = *(byte *)(UVar3 + 1) >> 3;
    uVar13 = bVar5 & 7;
    (pMyDisasm->Reserved_).REGOPCODE = uVar13;
    if (uVar13 == 1) {
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"dec",4);
      (pMyDisasm->Reserved_).OperandSize = 8;
      (pMyDisasm->Reserved_).MemDecoration = 1;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar6 = EFLAGS_TABLE[0x1e].SF_;
      UVar7 = EFLAGS_TABLE[0x1e].ZF_;
      UVar8 = EFLAGS_TABLE[0x1e].AF_;
      UVar9 = EFLAGS_TABLE[0x1e].PF_;
      UVar10 = EFLAGS_TABLE[0x1e].CF_;
      UVar11 = EFLAGS_TABLE[0x1e].TF_;
      UVar12 = EFLAGS_TABLE[0x1e].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x1e].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar6;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar7;
      (pMyDisasm->Instruction).Flags.AF_ = UVar8;
      (pMyDisasm->Instruction).Flags.PF_ = UVar9;
      (pMyDisasm->Instruction).Flags.CF_ = UVar10;
      (pMyDisasm->Instruction).Flags.TF_ = UVar11;
      (pMyDisasm->Instruction).Flags.IF_ = UVar12;
      uVar14 = EFLAGS_TABLE[0x1e]._8_4_;
    }
    else {
      if ((bVar5 & 7) != 0) {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
        (pMyDisasm->Operand1).AccessMode = 0;
        (pMyDisasm->Operand2).AccessMode = 0;
        (pMyDisasm->Operand3).AccessMode = 0;
        (pMyDisasm->Operand4).AccessMode = 0;
        (pMyDisasm->Operand5).AccessMode = 0;
        (pMyDisasm->Operand6).AccessMode = 0;
        (pMyDisasm->Operand7).AccessMode = 0;
        (pMyDisasm->Operand8).AccessMode = 0;
        (pMyDisasm->Operand9).AccessMode = 0;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
        return;
      }
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"inc",4);
      (pMyDisasm->Reserved_).OperandSize = 8;
      (pMyDisasm->Reserved_).MemDecoration = 1;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar6 = EFLAGS_TABLE[0x28].SF_;
      UVar7 = EFLAGS_TABLE[0x28].ZF_;
      UVar8 = EFLAGS_TABLE[0x28].AF_;
      UVar9 = EFLAGS_TABLE[0x28].PF_;
      UVar10 = EFLAGS_TABLE[0x28].CF_;
      UVar11 = EFLAGS_TABLE[0x28].TF_;
      UVar12 = EFLAGS_TABLE[0x28].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x28].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar6;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar7;
      (pMyDisasm->Instruction).Flags.AF_ = UVar8;
      (pMyDisasm->Instruction).Flags.PF_ = UVar9;
      (pMyDisasm->Instruction).Flags.CF_ = UVar10;
      (pMyDisasm->Instruction).Flags.TF_ = UVar11;
      (pMyDisasm->Instruction).Flags.IF_ = UVar12;
      uVar14 = EFLAGS_TABLE[0x28]._8_4_;
    }
    (pMyDisasm->Instruction).Flags.DF_ = (UInt8)uVar14;
    (pMyDisasm->Instruction).Flags.NT_ = SUB41(uVar14,1);
    (pMyDisasm->Instruction).Flags.RF_ = SUB41(uVar14,2);
    (pMyDisasm->Instruction).Flags.alignment = SUB41(uVar14,3);
  }
  return;
}

Assistant:

void __bea_callspec__ G4_Eb(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 0) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "inc");
        #endif
        Eb(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 40);
    }
    else if (GV.REGOPCODE == 1) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "dec");
        #endif
        Eb(pMyDisasm);
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 30);
    }
    else {
        failDecode(pMyDisasm);
    }
}